

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

void lj_ir_growbot(jit_State *J)

{
  undefined8 *puVar1;
  uint uVar2;
  void *pvVar3;
  IRIns *pIVar4;
  uint local_48;
  MSize ofs_1;
  IRIns *newbase;
  MSize ofs;
  MSize szins;
  IRIns *baseir;
  jit_State *J_local;
  
  pIVar4 = J->irbuf + J->irbotlim;
  uVar2 = J->irtoplim - J->irbotlim;
  if ((J->cur).nins + (uVar2 >> 1) < J->irtoplim) {
    uVar2 = uVar2 >> 2;
    memmove(pIVar4 + uVar2,pIVar4,(ulong)((J->cur).nins - J->irbotlim) << 3);
    J->irbotlim = J->irbotlim - uVar2;
    J->irtoplim = J->irtoplim - uVar2;
    J->irbuf = pIVar4 + -(ulong)J->irbotlim;
    (J->cur).ir = pIVar4 + -(ulong)J->irbotlim;
  }
  else {
    pvVar3 = lj_mem_realloc(J->L,(void *)0x0,0,(ulong)(uVar2 * 2) << 3);
    if (uVar2 < 0x100) {
      local_48 = uVar2 >> 1;
    }
    else {
      local_48 = 0x80;
    }
    memcpy((void *)((long)pvVar3 + (ulong)local_48 * 8),pIVar4,
           (ulong)((J->cur).nins - J->irbotlim) << 3);
    puVar1 = (undefined8 *)(J->L->glref).ptr64;
    puVar1[2] = puVar1[2] + (ulong)uVar2 * -8;
    (*(code *)*puVar1)(puVar1[1],pIVar4,(ulong)uVar2 * 8,0);
    J->irbotlim = J->irbotlim - local_48;
    J->irtoplim = J->irbotlim + uVar2 * 2;
    pIVar4 = (IRIns *)((long)pvVar3 + (ulong)J->irbotlim * -8);
    J->irbuf = pIVar4;
    (J->cur).ir = pIVar4;
  }
  return;
}

Assistant:

static void lj_ir_growbot(jit_State *J)
{
  IRIns *baseir = J->irbuf + J->irbotlim;
  MSize szins = J->irtoplim - J->irbotlim;
  lj_assertJ(szins != 0, "zero IR size");
  lj_assertJ(J->cur.nk == J->irbotlim || J->cur.nk-1 == J->irbotlim,
	     "unexpected IR growth");
  if (J->cur.nins + (szins >> 1) < J->irtoplim) {
    /* More than half of the buffer is free on top: shift up by a quarter. */
    MSize ofs = szins >> 2;
    memmove(baseir + ofs, baseir, (J->cur.nins - J->irbotlim)*sizeof(IRIns));
    J->irbotlim -= ofs;
    J->irtoplim -= ofs;
    J->cur.ir = J->irbuf = baseir - J->irbotlim;
  } else {
    /* Double the buffer size, but split the growth amongst top/bottom. */
    IRIns *newbase = lj_mem_newt(J->L, 2*szins*sizeof(IRIns), IRIns);
    MSize ofs = szins >= 256 ? 128 : (szins >> 1);  /* Limit bottom growth. */
    memcpy(newbase + ofs, baseir, (J->cur.nins - J->irbotlim)*sizeof(IRIns));
    lj_mem_free(G(J->L), baseir, szins*sizeof(IRIns));
    J->irbotlim -= ofs;
    J->irtoplim = J->irbotlim + 2*szins;
    J->cur.ir = J->irbuf = newbase - J->irbotlim;
  }
}